

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O3

void a0idalloc(void *ptr,_Bool is_internal)

{
  long *plVar1;
  ulong uVar2;
  void *pvVar3;
  long lVar4;
  ulong uVar5;
  rtree_leaf_elm_t *prVar6;
  ulong *puVar7;
  long lVar8;
  undefined7 in_register_00000031;
  ulong uVar9;
  uint uVar10;
  rtree_ctx_t rtree_ctx_fallback;
  ulong auStack_1b8 [3];
  rtree_ctx_t local_1a0;
  
  if ((int)CONCAT71(in_register_00000031,is_internal) != 0) {
    auStack_1b8[1] = 0x1d4e648;
    duckdb_je_rtree_ctx_data_init(&local_1a0);
    prVar6 = local_1a0.l2_cache[0].leaf;
    uVar10 = (uint)((ulong)ptr >> 0x1e) & 0xf;
    uVar9 = (ulong)ptr & 0xffffffffc0000000;
    uVar5 = (ulong)(uVar10 << 4);
    puVar7 = (ulong *)((long)&local_1a0.cache[0].leafkey + uVar5);
    uVar2 = *puVar7;
    if (uVar2 == uVar9) {
      prVar6 = (rtree_leaf_elm_t *)
               ((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) +
               *(long *)((long)&local_1a0.cache[0].leaf + uVar5));
    }
    else if (local_1a0.l2_cache[0].leafkey == uVar9) {
      local_1a0.l2_cache[0].leafkey = uVar2;
      local_1a0.l2_cache[0].leaf = *(rtree_leaf_elm_t **)((long)&local_1a0.cache[0].leaf + uVar5);
      *puVar7 = uVar9;
      *(rtree_leaf_elm_t **)((long)&local_1a0.cache[0].leaf + uVar5) = prVar6;
      prVar6 = (rtree_leaf_elm_t *)
               ((long)&(prVar6->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
    }
    else {
      lVar8 = 0x118;
      do {
        if (*(ulong *)((long)auStack_1b8 + lVar8 + 0x10) == uVar9) {
          lVar4 = *(long *)((long)&local_1a0.cache[0].leafkey + lVar8);
          *(undefined8 *)((long)auStack_1b8 + lVar8 + 0x10) =
               *(undefined8 *)((long)auStack_1b8 + lVar8);
          *(undefined8 *)((long)&local_1a0.cache[0].leafkey + lVar8) =
               *(undefined8 *)((long)auStack_1b8 + lVar8 + 8);
          *(ulong *)((long)auStack_1b8 + lVar8) = uVar2;
          *(undefined8 *)((long)auStack_1b8 + lVar8 + 8) =
               *(undefined8 *)((long)&local_1a0.cache[0].leaf + uVar5);
          *puVar7 = uVar9;
          *(long *)((long)&local_1a0.cache[0].leaf + uVar5) = lVar4;
          prVar6 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + lVar4);
          goto LAB_01d4e685;
        }
        lVar8 = lVar8 + 0x10;
      } while (lVar8 != 0x188);
      auStack_1b8[1] = 0x1d4e7b8;
      prVar6 = duckdb_je_rtree_leaf_elm_lookup_hard
                         ((tsdn_t *)0x0,&duckdb_je_arena_emap_global.rtree,&local_1a0,(uintptr_t)ptr
                          ,true,false);
    }
LAB_01d4e685:
    pvVar3 = duckdb_je_arenas
             [*(uint *)(((long)(prVar6->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80) & 0xfff
             ].repr;
    auStack_1b8[1] = 0x1d4e6b0;
    duckdb_je_rtree_ctx_data_init(&local_1a0);
    prVar6 = local_1a0.l2_cache[0].leaf;
    uVar5 = (ulong)(uVar10 << 4);
    puVar7 = (ulong *)((long)&local_1a0.cache[0].leafkey + uVar5);
    uVar2 = *puVar7;
    if (uVar2 == uVar9) {
      prVar6 = (rtree_leaf_elm_t *)
               ((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) +
               *(long *)((long)&local_1a0.cache[0].leaf + uVar5));
    }
    else if (local_1a0.l2_cache[0].leafkey == uVar9) {
      local_1a0.l2_cache[0].leafkey = uVar2;
      local_1a0.l2_cache[0].leaf = *(rtree_leaf_elm_t **)((long)&local_1a0.cache[0].leaf + uVar5);
      *puVar7 = uVar9;
      *(rtree_leaf_elm_t **)((long)&local_1a0.cache[0].leaf + uVar5) = prVar6;
      prVar6 = (rtree_leaf_elm_t *)
               ((long)&(prVar6->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
    }
    else {
      lVar8 = 0x118;
      do {
        if (*(ulong *)((long)auStack_1b8 + lVar8 + 0x10) == uVar9) {
          lVar4 = *(long *)((long)&local_1a0.cache[0].leafkey + lVar8);
          *(undefined8 *)((long)auStack_1b8 + lVar8 + 0x10) =
               *(undefined8 *)((long)auStack_1b8 + lVar8);
          *(undefined8 *)((long)&local_1a0.cache[0].leafkey + lVar8) =
               *(undefined8 *)((long)auStack_1b8 + lVar8 + 8);
          *(ulong *)((long)auStack_1b8 + lVar8) = uVar2;
          *(undefined8 *)((long)auStack_1b8 + lVar8 + 8) =
               *(undefined8 *)((long)&local_1a0.cache[0].leaf + uVar5);
          *puVar7 = uVar9;
          *(long *)((long)&local_1a0.cache[0].leaf + uVar5) = lVar4;
          prVar6 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + lVar4);
          goto LAB_01d4e6d2;
        }
        lVar8 = lVar8 + 0x10;
      } while (lVar8 != 0x188);
      auStack_1b8[1] = 0x1d4e7f4;
      prVar6 = duckdb_je_rtree_leaf_elm_lookup_hard
                         ((tsdn_t *)0x0,&duckdb_je_arena_emap_global.rtree,&local_1a0,(uintptr_t)ptr
                          ,true,false);
    }
LAB_01d4e6d2:
    LOCK();
    plVar1 = (long *)((long)pvVar3 + 0x48);
    *plVar1 = *plVar1 - duckdb_je_sz_index2size_tab[(ulong)(prVar6->le_bits).repr >> 0x30];
    UNLOCK();
  }
  auStack_1b8[1] = 0x1d4e6f4;
  arena_dalloc_no_tcache((tsdn_t *)0x0,ptr);
  return;
}

Assistant:

static void
a0idalloc(void *ptr, bool is_internal) {
	idalloctm(TSDN_NULL, ptr, NULL, NULL, is_internal, true);
}